

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O0

void __thiscall
celero::Pimpl<celero::Experiment::Impl>::Pimpl<std::weak_ptr<celero::Benchmark>&>
          (Pimpl<celero::Experiment::Impl> *this,weak_ptr<celero::Benchmark> *arg1)

{
  Impl *this_00;
  weak_ptr<celero::Benchmark> local_28;
  weak_ptr<celero::Benchmark> *local_18;
  weak_ptr<celero::Benchmark> *arg1_local;
  Pimpl<celero::Experiment::Impl> *this_local;
  
  local_18 = arg1;
  arg1_local = (weak_ptr<celero::Benchmark> *)this;
  this_00 = (Impl *)operator_new(0x90);
  std::weak_ptr<celero::Benchmark>::weak_ptr(&local_28,local_18);
  Experiment::Impl::Impl(this_00,&local_28);
  std::unique_ptr<celero::Experiment::Impl,std::default_delete<celero::Experiment::Impl>>::
  unique_ptr<std::default_delete<celero::Experiment::Impl>,void>
            ((unique_ptr<celero::Experiment::Impl,std::default_delete<celero::Experiment::Impl>> *)
             this,this_00);
  std::weak_ptr<celero::Benchmark>::~weak_ptr(&local_28);
  return;
}

Assistant:

Pimpl<T>::Pimpl(Arg1&& arg1) : _pimpl(new T(std::forward<Arg1>(arg1)))
	{
	}